

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O1

JavascriptString * __thiscall
Js::DateImplementation::GetISOString(DateImplementation *this,ScriptContext *requestContext)

{
  bool bVar1;
  CompoundString *bs;
  
  bVar1 = NumberUtilities::IsFinite(this->m_tvUtc);
  if (bVar1) {
    bs = CompoundString::NewWithCharCapacity
                   (0x1e,(requestContext->super_ScriptContextBase).javascriptLibrary);
    GetDateComponent(this,bs,(DateData)0x1,0,requestContext);
    CompoundString::AppendChars(bs,L'-');
    GetDateComponent(this,bs,(DateData)0x2,1,requestContext);
    CompoundString::AppendChars(bs,L'-');
    GetDateComponent(this,bs,(DateData)0x3,0,requestContext);
    CompoundString::AppendChars(bs,L'T');
    GetDateComponent(this,bs,(DateData)0x4,0,requestContext);
    CompoundString::AppendChars(bs,L':');
    GetDateComponent(this,bs,(DateData)0x5,0,requestContext);
    CompoundString::AppendChars(bs,L':');
    GetDateComponent(this,bs,(DateData)0x6,0,requestContext);
    CompoundString::AppendChars(bs,L'.');
    GetDateComponent(this,bs,(DateData)0x7,0,requestContext);
    CompoundString::AppendChars(bs,L'Z');
    return (JavascriptString *)bs;
  }
  JavascriptError::ThrowRangeError(requestContext,-0x7ff5ec77,(PCWSTR)0x0);
}

Assistant:

JavascriptString*
    DateImplementation::GetISOString(ScriptContext* requestContext)
    {
        // ES5 15.9.5.43: throw RangeError if time value is not a finite number
        if (!Js::NumberUtilities::IsFinite(m_tvUtc))
        {
            JavascriptError::ThrowRangeError(requestContext, JSERR_NeedNumber);
        }

        CompoundString *const bs = CompoundString::NewWithCharCapacity(30, requestContext->GetLibrary());

        GetDateComponent(bs, DateData::FullYear, 0, requestContext);
        bs->AppendChars(_u('-'));
        // month
        GetDateComponent(bs, DateData::Month, 1/*adjustment*/, requestContext);
        bs->AppendChars(_u('-'));
        // date
        GetDateComponent(bs, DateData::Date, 0, requestContext);
        bs->AppendChars(_u('T'));
        // hours
        GetDateComponent(bs, DateData::Hours, 0, requestContext);
        bs->AppendChars(_u(':'));
        // minutes
        GetDateComponent(bs, DateData::Minutes, 0, requestContext);
        bs->AppendChars(_u(':'));
        // seconds
        GetDateComponent(bs, DateData::Seconds, 0, requestContext);

        // ES5 fill in milliseconds but v5.8 does not
        bs->AppendChars(_u('.'));
        // milliseconds
        GetDateComponent(bs, DateData::Milliseconds, 0, requestContext);

        bs->AppendChars(_u('Z'));

        return bs;
    }